

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bgets(bNgetc getcPtr,void *parm,char terminator)

{
  int iVar1;
  bstring local_30;
  bstring buff;
  int ret;
  char terminator_local;
  void *parm_local;
  bNgetc getcPtr_local;
  
  if ((getcPtr != (bNgetc)0x0) && (local_30 = bfromcstr(""), local_30 != (bstring)0x0)) {
    iVar1 = bgetsa(local_30,getcPtr,parm,terminator);
    if ((iVar1 < 0) || (local_30->slen < 1)) {
      bdestroy(local_30);
      local_30 = (bstring)0x0;
    }
    return local_30;
  }
  return (bstring)0x0;
}

Assistant:

bstring bgets (bNgetc getcPtr, void * parm, char terminator) {
int ret;
bstring buff;

	if (NULL == getcPtr || NULL == (buff = bfromcstr (""))) return NULL;

	ret = bgetsa (buff, getcPtr, parm, terminator);
	if (ret < 0 || buff->slen <= 0) {
		bdestroy (buff);
		buff = NULL;
	}
	return buff;
}